

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::addedCols(SPxSolverBase<double> *this,int n)

{
  SPxStatus SVar1;
  int in_ESI;
  SPxLPBase<double> *in_RDI;
  int in_stack_0000005c;
  SPxBasisBase<double> *in_stack_00000060;
  
  if (0 < in_ESI) {
    SPxLPBase<double>::addedCols(in_RDI,in_ESI);
    (*(in_RDI->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])();
    (*(in_RDI->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x79])();
    SVar1 = SPxBasisBase<double>::status((SPxBasisBase<double> *)(in_RDI + 1));
    if (NO_PROBLEM < SVar1) {
      SPxBasisBase<double>::addedCols(in_stack_00000060,in_stack_0000005c);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::addedCols(int n)
{

   if(n > 0)
   {
      SPxLPBase<R>::addedCols(n);

      unInit();
      reDim();

      if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
         SPxBasisBase<R>::addedCols(n);
   }

   /* we must not assert consistency here, since addedRows() might be still necessary to obtain a consistent basis */
}